

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264.c
# Opt level: O0

int h264_hrd_parameters(bitstream *str,h264_hrd_parameters *hrd)

{
  int iVar1;
  bitstream *in_RSI;
  int i;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  vs_dir vVar2;
  int local_4;
  
  iVar1 = vs_ue(in_RSI,(uint32_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (iVar1 == 0) {
    if (in_RSI->dir < 0x20) {
      iVar1 = vs_u(in_RSI,(uint32_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffdc);
      if (iVar1 == 0) {
        iVar1 = vs_u(in_RSI,(uint32_t *)
                            CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffdc);
        if (iVar1 == 0) {
          for (vVar2 = VS_ENCODE; vVar2 <= in_RSI->dir; vVar2 = vVar2 + VS_DECODE) {
            iVar1 = vs_ue(in_RSI,(uint32_t *)CONCAT44(vVar2,in_stack_ffffffffffffffe0));
            if (iVar1 != 0) {
              return 1;
            }
            iVar1 = vs_ue(in_RSI,(uint32_t *)CONCAT44(vVar2,in_stack_ffffffffffffffe0));
            if (iVar1 != 0) {
              return 1;
            }
            iVar1 = vs_u(in_RSI,(uint32_t *)CONCAT44(vVar2,in_stack_ffffffffffffffe0),
                         in_stack_ffffffffffffffdc);
            if (iVar1 != 0) {
              return 1;
            }
          }
          iVar1 = vs_u(in_RSI,(uint32_t *)CONCAT44(vVar2,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffdc);
          if (iVar1 == 0) {
            iVar1 = vs_u(in_RSI,(uint32_t *)CONCAT44(vVar2,in_stack_ffffffffffffffe0),
                         in_stack_ffffffffffffffdc);
            if (iVar1 == 0) {
              iVar1 = vs_u(in_RSI,(uint32_t *)CONCAT44(vVar2,in_stack_ffffffffffffffe0),
                           in_stack_ffffffffffffffdc);
              if (iVar1 == 0) {
                iVar1 = vs_u(in_RSI,(uint32_t *)CONCAT44(vVar2,in_stack_ffffffffffffffe0),
                             in_stack_ffffffffffffffdc);
                if (iVar1 == 0) {
                  local_4 = 0;
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      fprintf(_stderr,"cpb_cnt_minus1 out of range\n");
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int h264_hrd_parameters(struct bitstream *str, struct h264_hrd_parameters *hrd) {
	if (vs_ue(str, &hrd->cpb_cnt_minus1)) return 1;
	if (hrd->cpb_cnt_minus1 > 31) {
		fprintf(stderr, "cpb_cnt_minus1 out of range\n");
		return 1;
	}
	if (vs_u(str, &hrd->bit_rate_scale, 4)) return 1;
	if (vs_u(str, &hrd->cpb_size_scale, 4)) return 1;
	int i;
	for (i = 0; i <= hrd->cpb_cnt_minus1; i++) {
		if (vs_ue(str, &hrd->bit_rate_value_minus1[i])) return 1;
		if (vs_ue(str, &hrd->cpb_size_value_minus1[i])) return 1;
		if (vs_u(str, &hrd->cbr_flag[i], 1)) return 1;
	}
	if (vs_u(str, &hrd->initial_cpb_removal_delay_length_minus1, 5)) return 1;
	if (vs_u(str, &hrd->cpb_removal_delay_length_minus1, 5)) return 1;
	if (vs_u(str, &hrd->dpb_output_delay_length_minus1, 5)) return 1;
	if (vs_u(str, &hrd->time_offset_length, 5)) return 1;
	return 0;
}